

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O2

void intobucket(bucket_conflict *b,list_conflict head,list_conflict tail,int size,group_conflict g)

{
  bucket_conflict pbVar1;
  bucket_conflict pbVar2;
  
  pbVar2 = *b;
  if ((pbVar2 == (bucket_conflict)0x0) || (pbVar2->tag != g)) {
    pbVar1 = (bucket_conflict)allocmem(bucketmem,0x28);
    pbVar1->next = pbVar2;
    pbVar1->head = head;
    pbVar1->size = size;
    pbVar1->tag = g;
    *b = pbVar1;
    pbVar2 = pbVar1;
  }
  else {
    pbVar2->tail->next = head;
    pbVar2->size = pbVar2->size + size;
  }
  tail->next = (list)0x0;
  pbVar2->tail = tail;
  return;
}

Assistant:

static void intobucket(bucket *b, list h, list t, int size,
                       character ch, character *chmin, character *chmax)
{
   if (!b->head) {
      b->head = h;
      b->tail = t;
      b->size = size;
      if (ch != '\0') {
         if (ch < *chmin) *chmin = ch;
         if (ch > *chmax) *chmax = ch;
      }
   } else {
      b->tail->next = h;
      b->tail = t;
      b->size += size;
   }
}